

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodySharedMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v
          (ChVariablesBodySharedMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  long lVar10;
  long lVar11;
  ChSharedMassBody *pCVar12;
  PointerType pdVar13;
  ulong *puVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  lVar10 = (vect->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value;
  iVar15 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])();
  if (lVar10 != iVar15) {
    __assert_fail("vect.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                  ,0x5c,
                  "virtual void chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar10 = *(long *)&(result->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ).field_0x8;
  iVar15 = (*(this->super_ChVariablesBody).super_ChVariables._vptr_ChVariables[2])(this);
  if (lVar10 != iVar15) {
    __assert_fail("result.size() == Get_ndof()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesBodySharedMass.cpp"
                  ,0x5d,
                  "virtual void chrono::ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  lVar10 = (vect->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           .m_rows.m_value;
  if (0 < lVar10) {
    lVar11 = *(long *)&(result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                       ).field_0x8;
    if (0 < lVar11) {
      pCVar12 = this->sharedmass;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pCVar12->inv_mass;
      pdVar13 = (vect->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_data;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *pdVar13;
      puVar14 = *(ulong **)
                 &result->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = *puVar14;
      auVar1 = vfmadd213sd_fma(auVar22,auVar16,auVar1);
      *puVar14 = auVar1._0_8_;
      if (lVar10 == 1) goto LAB_007fbc7e;
      if (lVar11 != 1) {
        auVar17._8_8_ = 0;
        auVar17._0_8_ = pCVar12->inv_mass;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = pdVar13[1];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = puVar14[1];
        auVar1 = vfmadd213sd_fma(auVar23,auVar17,auVar2);
        puVar14[1] = auVar1._0_8_;
        if (lVar10 < 3) goto LAB_007fbc7e;
        if (2 < lVar11) {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = pCVar12->inv_mass;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = pdVar13[2];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = puVar14[2];
          auVar1 = vfmadd213sd_fma(auVar24,auVar18,auVar3);
          puVar14[2] = auVar1._0_8_;
          if (((lVar10 == 3) || (lVar10 < 5)) || (lVar10 == 5)) goto LAB_007fbc7e;
          if (lVar11 != 3) {
            auVar19._8_8_ = 0;
            auVar19._0_8_ =
                 (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
            auVar4._8_8_ = 0;
            auVar4._0_8_ = pdVar13[3];
            auVar25._8_8_ = 0;
            auVar25._0_8_ =
                 (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1] * pdVar13[4];
            auVar1 = vfmadd231sd_fma(auVar25,auVar19,auVar4);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = pdVar13[5];
            auVar1 = vfmadd231sd_fma(auVar1,auVar28,auVar5);
            puVar14[3] = (ulong)(auVar1._0_8_ + (double)puVar14[3]);
            if (4 < lVar11) {
              auVar20._8_8_ = 0;
              auVar20._0_8_ =
                   (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
              auVar26._8_8_ = 0;
              auVar26._0_8_ =
                   (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
              auVar6._8_8_ = 0;
              auVar6._0_8_ = pdVar13[3];
              auVar29._8_8_ = 0;
              auVar29._0_8_ =
                   (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4] * pdVar13[4];
              auVar1 = vfmadd231sd_fma(auVar29,auVar26,auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = pdVar13[5];
              auVar1 = vfmadd231sd_fma(auVar1,auVar20,auVar7);
              puVar14[4] = (ulong)(auVar1._0_8_ + (double)puVar14[4]);
              if (lVar11 != 5) {
                auVar21._8_8_ = 0;
                auVar21._0_8_ =
                     (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
                auVar27._8_8_ = 0;
                auVar27._0_8_ =
                     (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
                auVar8._8_8_ = 0;
                auVar8._0_8_ = pdVar13[3];
                auVar30._8_8_ = 0;
                auVar30._0_8_ =
                     (pCVar12->inv_inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7] * pdVar13[4];
                auVar1 = vfmadd231sd_fma(auVar30,auVar27,auVar8);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = pdVar13[5];
                auVar1 = vfmadd231sd_fma(auVar1,auVar21,auVar9);
                puVar14[5] = (ulong)(auVar1._0_8_ + (double)puVar14[5]);
                return;
              }
            }
          }
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                 );
  }
LAB_007fbc7e:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
               );
}

Assistant:

void ChVariablesBodySharedMass::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(vect.size() == Get_ndof());
    assert(result.size() == Get_ndof());

    // optimized unrolled operations
    result(0) += sharedmass->inv_mass * vect(0);
    result(1) += sharedmass->inv_mass * vect(1);
    result(2) += sharedmass->inv_mass * vect(2);
    result(3) += sharedmass->inv_inertia(0, 0) * vect(3) + sharedmass->inv_inertia(0, 1) * vect(4) +
                 sharedmass->inv_inertia(0, 2) * vect(5);
    result(4) += sharedmass->inv_inertia(1, 0) * vect(3) + sharedmass->inv_inertia(1, 1) * vect(4) +
                 sharedmass->inv_inertia(1, 2) * vect(5);
    result(5) += sharedmass->inv_inertia(2, 0) * vect(3) + sharedmass->inv_inertia(2, 1) * vect(4) +
                 sharedmass->inv_inertia(2, 2) * vect(5);
}